

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# action.h
# Opt level: O0

void __thiscall re2c::Action::set_initial(Action *this,label_t label,bool used_marker)

{
  Initial *this_00;
  bool used_marker_local;
  Action *this_local;
  label_t label_local;
  
  clear(this);
  this->type = INITIAL;
  this_00 = (Initial *)operator_new(8);
  Initial::Initial(this_00,label,used_marker);
  (this->info).initial = this_00;
  return;
}

Assistant:

void set_initial (label_t label, bool used_marker)
	{
		clear ();
		type = INITIAL;
		info.initial = new Initial (label, used_marker);
	}